

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

void setpath(lua_State *L,char *fieldname,char *envname,char *def,int noenv)

{
  char *pcVar1;
  int idx;
  char *in_RCX;
  lua_State *in_RDX;
  char *in_RDI;
  int in_R8D;
  int unaff_retaddr;
  char *path;
  char *in_stack_00001fe8;
  char *in_stack_00001ff0;
  char *in_stack_00001ff8;
  lua_State *in_stack_00002000;
  undefined4 in_stack_ffffffffffffffd8;
  
  pcVar1 = getenv((char *)in_RDX);
  if ((pcVar1 == (char *)0x0) || (in_R8D != 0)) {
    lua_pushstring(in_RDX,in_RCX);
  }
  else {
    pcVar1 = luaL_gsub(in_stack_00002000,in_stack_00001ff8,in_stack_00001ff0,in_stack_00001fe8);
    idx = (int)((ulong)pcVar1 >> 0x20);
    luaL_gsub(in_stack_00002000,in_stack_00001ff8,in_stack_00001ff0,in_stack_00001fe8);
    lua_remove((lua_State *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),idx);
  }
  lua_setfield((lua_State *)path,unaff_retaddr,in_RDI);
  return;
}

Assistant:

static void setpath(lua_State *L, const char *fieldname, const char *envname,
		    const char *def, int noenv)
{
#if LJ_TARGET_CONSOLE
  const char *path = NULL;
  UNUSED(envname);
#else
  const char *path = getenv(envname);
#endif
  if (path == NULL || noenv) {
    lua_pushstring(L, def);
  } else {
    path = luaL_gsub(L, path, LUA_PATHSEP LUA_PATHSEP,
			      LUA_PATHSEP AUXMARK LUA_PATHSEP);
    luaL_gsub(L, path, AUXMARK, def);
    lua_remove(L, -2);
  }
  setprogdir(L);
  lua_setfield(L, -2, fieldname);
}